

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O2

bool __thiscall
iutest::detail::TypedTestSuitePState::AddTestName
          (TypedTestSuitePState *this,char *file,int line,char *testsuite_name,char *test_name)

{
  ostream *poVar1;
  int line_00;
  char *test_name_local;
  string local_1d8;
  undefined1 local_1b8 [400];
  
  test_name_local = test_name;
  if (this->m_names != (char *)0x0) {
    line_00 = 0x1aa;
    IUTestLog::IUTestLog
              ((IUTestLog *)local_1b8,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/../include/gtest/../iutest_typed_tests.hpp"
               ,0x1aa);
    FormatCompilerIndependentFileLocation_abi_cxx11_
              (&local_1d8,(detail *)file,(char *)(ulong)(uint)line,line_00);
    poVar1 = std::operator<<((ostream *)(local_1b8 + 0x18),(string *)&local_1d8);
    poVar1 = std::operator<<(poVar1,": Test \"");
    poVar1 = std::operator<<(poVar1,test_name);
    poVar1 = std::operator<<(poVar1,"\" must be defined before IUTEST_REGISTER_TYPED_TEST_SUITE_P(")
    ;
    poVar1 = std::operator<<(poVar1,testsuite_name);
    std::operator<<(poVar1,", ...).\n");
    std::__cxx11::string::~string((string *)&local_1d8);
    IUTestLog::~IUTestLog((IUTestLog *)local_1b8);
  }
  std::
  _Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
  ::_M_insert_unique<char_const*const&>
            ((_Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
              *)&this->m_list,&test_name_local);
  return true;
}

Assistant:

bool AddTestName(const char* file, int line, const char* testsuite_name, const char* test_name)
    {
        if( m_names != NULL )
        {
            IUTEST_LOG_(WARNING) << detail::FormatCompilerIndependentFileLocation(file, line)
                << ": Test \"" << test_name << "\" must be defined before IUTEST_REGISTER_TYPED_TEST_SUITE_P("
                << testsuite_name << ", ...).\n";
        }
#if IUTEST_TYPED_TEST_P_STRICT
        m_list.insert(test_name);
#endif
        return true;
    }